

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# float.c
# Opt level: O1

sysbvm_tuple_t
sysbvm_float32_primitive_subtract
          (sysbvm_context_t *context,sysbvm_tuple_t closure,size_t argumentCount,
          sysbvm_tuple_t *arguments)

{
  ulong uVar1;
  float fVar2;
  float fVar3;
  sysbvm_object_tuple_t *floatObject;
  
  if (argumentCount != 2) {
    sysbvm_error_argumentCountMismatch(2,argumentCount);
  }
  uVar1 = *arguments;
  if ((uVar1 & 0xf) == 0 && uVar1 != 0) {
    fVar2 = *(float *)(uVar1 + 0x10);
  }
  else {
    fVar2 = (float)(uVar1 >> 4);
  }
  uVar1 = arguments[1];
  if ((uVar1 & 0xf) == 0 && uVar1 != 0) {
    fVar3 = *(float *)(uVar1 + 0x10);
  }
  else {
    fVar3 = (float)(uVar1 >> 4);
  }
  return (ulong)(uint)(fVar2 - fVar3) << 4 | 0xd;
}

Assistant:

static sysbvm_tuple_t sysbvm_float32_primitive_subtract(sysbvm_context_t *context, sysbvm_tuple_t closure, size_t argumentCount, sysbvm_tuple_t *arguments)
{
    (void)context;
    (void)closure;
    if(argumentCount != 2) sysbvm_error_argumentCountMismatch(2, argumentCount);

    sysbvm_float32_t left = sysbvm_tuple_float32_decode(arguments[0]);
    sysbvm_float32_t right = sysbvm_tuple_float32_decode(arguments[1]);
    return sysbvm_tuple_float32_encode(context, left - right);
}